

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  bool local_1dd;
  typed_flags<f1,_f2,_f3,_f4,_f5,_f6,_f7,_f8,_f9> flags_9;
  typed_flags<f1,_f2,_f3,_f4,_f5,_f6,_f7,_f8> flags_8;
  invalid_argument *anon_var_9;
  flags_storage<3ul> local_128 [37];
  typed_flags<eats_meat,eats_grass,has_tail> local_103;
  typed_flags<eats_meat,eats_grass,has_tail> local_102;
  flags_storage<3UL> local_101;
  flags_storage<3ul> local_100 [7];
  typed_flags<eats_meat,_eats_grass,_has_tail> a3;
  typed_flags<eats_meat,eats_grass,has_tail> local_db;
  typed_flags<eats_meat,eats_grass,has_tail> local_da;
  flags_storage<3UL> local_d9;
  flags_storage<3ul> local_d8 [7];
  typed_flags<eats_meat,_eats_grass,_has_tail> a2;
  typed_flags<eats_meat,eats_grass,has_tail> local_b8;
  typed_flags<eats_meat,eats_grass,has_tail> local_b7;
  flags_storage<3UL> local_b6;
  flag<has_tail> local_b5;
  flag<eats_grass> local_b4;
  flag<eats_meat> local_b3;
  flag<eats_grass> local_b2;
  flag<eats_meat> local_b1;
  flag<eats_meat> local_b0;
  flag<eats_grass> local_af;
  typed_flags<eats_meat,_eats_grass,_has_tail> a1;
  flag<has_tail> f3;
  flag<eats_grass> f2;
  flag<eats_meat> f1;
  flag local_aa;
  typed_flags<eats_meat,_eats_grass,_has_tail> local_a9;
  typed_flags<eats_meat,_eats_grass,_has_tail> local_a8;
  typed_flags<eats_meat,_eats_grass,_has_tail> local_a7;
  flags_storage<3UL> local_a6;
  array<unsigned_char,_1UL> local_a5;
  flag<int> int_flag;
  flag<int> const_int_flag_1;
  flag<int> const_int_flag_0;
  flags_storage<3UL> local_a1;
  flags_storage<3ul> local_a0 [4];
  human engineer;
  animal tmp;
  animal unknown;
  animal rabbit;
  flags_storage<3ul> local_80 [32];
  flags_storage<3ul> local_60 [48];
  flags_storage<3ul> local_30 [33];
  array<unsigned_char,_1UL> local_f;
  typed_flags<> local_e;
  typed_flags<> local_d;
  undefined4 local_c;
  animal wolf;
  typed_flags<> empty;
  
  local_c = 0;
  tfl::typed_flags<>::typed_flags(&local_d);
  iVar3 = tfl::detail::flags_storage<0UL>::to_integral<int>((flags_storage<0UL> *)&local_d);
  if (iVar3 != 0) {
    __assert_fail("empty.to_integral<int>() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x1b,"int main()");
  }
  bVar1 = tfl::detail::typed_flags_facet<tfl::typed_flags<>_>::none<>
                    ((typed_flags_facet<tfl::typed_flags<>_> *)&local_d);
  if (!bVar1) {
    __assert_fail("empty.none<>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x1c,"int main()");
  }
  bVar1 = tfl::typed_flags<>::any<>(&local_d);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!empty.any<>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x1d,"int main()");
  }
  bVar1 = tfl::detail::typed_flags_facet<tfl::typed_flags<>_>::all<>
                    ((typed_flags_facet<tfl::typed_flags<>_> *)&local_d);
  if (!bVar1) {
    __assert_fail("empty.all<>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x1e,"int main()");
  }
  tfl::typed_flags<>::typed_flags(&local_e,1);
  local_d = local_e;
  iVar3 = tfl::detail::flags_storage<0UL>::to_integral<int>((flags_storage<0UL> *)&local_d);
  if (iVar3 != 0) {
    __assert_fail("empty.to_integral<int>() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x20,"int main()");
  }
  tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::typed_flags
            ((typed_flags<eats_meat,_eats_grass,_has_tail> *)&local_f);
  bVar1 = tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::test<eats_meat>
                    ((typed_flags<eats_meat,_eats_grass,_has_tail> *)&local_f);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!wolf.test<eats_meat>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x2a,"int main()");
  }
  bVar1 = tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::test<eats_grass>
                    ((typed_flags<eats_meat,_eats_grass,_has_tail> *)&local_f);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!wolf.test<eats_grass>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x2b,"int main()");
  }
  bVar1 = tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::test<has_tail>
                    ((typed_flags<eats_meat,_eats_grass,_has_tail> *)&local_f);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!wolf.test<has_tail>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x2c,"int main()");
  }
  tfl::detail::flags_storage<3ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            (local_30,(char)&local_f,'0');
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"000");
  if (!bVar1) {
    __assert_fail("wolf.to_string() == \"000\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x2d,"int main()");
  }
  std::__cxx11::string::~string((string *)local_30);
  tfl::detail::typed_flags_facet<tfl::typed_flags<eats_meat,_eats_grass,_has_tail>_>::set<eats_meat>
            ((typed_flags_facet<tfl::typed_flags<eats_meat,_eats_grass,_has_tail>_> *)&local_f,true)
  ;
  bVar1 = tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::test<eats_meat>
                    ((typed_flags<eats_meat,_eats_grass,_has_tail> *)&local_f);
  if (!bVar1) {
    __assert_fail("wolf.test<eats_meat>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x2f,"int main()");
  }
  tfl::detail::flags_storage<3ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            (local_60,(char)&local_f,'0');
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60,"001");
  if (!bVar1) {
    __assert_fail("wolf.to_string() == \"001\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x30,"int main()");
  }
  std::__cxx11::string::~string((string *)local_60);
  tfl::detail::typed_flags_facet<tfl::typed_flags<eats_meat,_eats_grass,_has_tail>_>::
  set<eats_grass>((typed_flags_facet<tfl::typed_flags<eats_meat,_eats_grass,_has_tail>_> *)&local_f,
                  true);
  bVar1 = tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::test<eats_grass>
                    ((typed_flags<eats_meat,_eats_grass,_has_tail> *)&local_f);
  if (!bVar1) {
    __assert_fail("wolf.test<eats_grass>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x32,"int main()");
  }
  tfl::detail::flags_storage<3ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            (local_80,(char)&local_f,'-');
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_80,"-11");
  if (!bVar1) {
    __assert_fail("wolf.to_string(\'-\') == \"-11\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x33,"int main()");
  }
  std::__cxx11::string::~string((string *)local_80);
  tfl::detail::typed_flags_facet<tfl::typed_flags<eats_meat,_eats_grass,_has_tail>_>::
  set<eats_grass>((typed_flags_facet<tfl::typed_flags<eats_meat,_eats_grass,_has_tail>_> *)&local_f,
                  false);
  bVar1 = tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::test<eats_grass>
                    ((typed_flags<eats_meat,_eats_grass,_has_tail> *)&local_f);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!wolf.test<eats_grass>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x35,"int main()");
  }
  tfl::detail::typed_flags_facet<tfl::typed_flags<eats_meat,_eats_grass,_has_tail>_>::set<has_tail>
            ((typed_flags_facet<tfl::typed_flags<eats_meat,_eats_grass,_has_tail>_> *)&local_f,true)
  ;
  bVar1 = tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::test<has_tail>
                    ((typed_flags<eats_meat,_eats_grass,_has_tail> *)&local_f);
  if (!bVar1) {
    __assert_fail("wolf.test<has_tail>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x37,"int main()");
  }
  iVar3 = tfl::detail::flags_storage<3UL>::to_integral<int>((flags_storage<3UL> *)&local_f);
  if (iVar3 != 5) {
    __assert_fail("wolf.to_integral<int>() == 5",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x38,"int main()");
  }
  tfl::detail::flags_storage<3ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            (local_a0,(char)&local_f,'-');
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_a0,"+-+");
  if (!bVar1) {
    __assert_fail("wolf.to_string(\'-\', \'+\') == \"+-+\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x39,"int main()");
  }
  std::__cxx11::string::~string((string *)local_a0);
  tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::typed_flags
            ((typed_flags<eats_meat,_eats_grass,_has_tail> *)&local_a1);
  tfl::detail::typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,has_tail>>::
  set<eats_grass,has_tail>
            ((typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,has_tail>> *)&local_a1,true);
  bVar1 = tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::test<eats_meat>
                    ((typed_flags<eats_meat,_eats_grass,_has_tail> *)&local_a1);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!rabbit.test<eats_meat>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x3d,"int main()");
  }
  bVar1 = tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::test<eats_grass>
                    ((typed_flags<eats_meat,_eats_grass,_has_tail> *)&local_a1);
  if (!bVar1) {
    __assert_fail("rabbit.test<eats_grass>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x3e,"int main()");
  }
  bVar1 = tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::test<has_tail>
                    ((typed_flags<eats_meat,_eats_grass,_has_tail> *)&local_a1);
  if (!bVar1) {
    __assert_fail("rabbit.test<has_tail>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x3f,"int main()");
  }
  iVar3 = tfl::detail::flags_storage<3UL>::to_integral<int>(&local_a1);
  if (iVar3 != 6) {
    __assert_fail("rabbit.to_integral<int>() == 6",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x40,"int main()");
  }
  tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::typed_flags
            ((typed_flags<eats_meat,_eats_grass,_has_tail> *)&const_int_flag_0);
  iVar3 = tfl::detail::flags_storage<3UL>::to_integral<int>((flags_storage<3UL> *)&const_int_flag_0)
  ;
  if (iVar3 != 0) {
    __assert_fail("unknown.to_integral<int>() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x43,"int main()");
  }
  bVar1 = tfl::detail::flags_storage<3UL>::none((flags_storage<3UL> *)&const_int_flag_0);
  if (!bVar1) {
    __assert_fail("unknown.none()",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x44,"int main()");
  }
  bVar1 = tfl::detail::flags_storage<3UL>::any((flags_storage<3UL> *)&const_int_flag_0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!unknown.any()",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x45,"int main()");
  }
  bVar1 = tfl::detail::flags_storage<3UL>::all((flags_storage<3UL> *)&const_int_flag_0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!unknown.all()",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x46,"int main()");
  }
  tfl::detail::flags_storage<3UL>::set((flags_storage<3UL> *)&const_int_flag_0);
  iVar3 = tfl::detail::flags_storage<3UL>::to_integral<int>((flags_storage<3UL> *)&const_int_flag_0)
  ;
  if (iVar3 != 7) {
    __assert_fail("unknown.to_integral<int>() == 7",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x48,"int main()");
  }
  bVar1 = tfl::detail::flags_storage<3UL>::none((flags_storage<3UL> *)&const_int_flag_0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!unknown.none()",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x49,"int main()");
  }
  bVar1 = tfl::detail::flags_storage<3UL>::any((flags_storage<3UL> *)&const_int_flag_0);
  if (!bVar1) {
    __assert_fail("unknown.any()",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x4a,"int main()");
  }
  bVar1 = tfl::detail::flags_storage<3UL>::all((flags_storage<3UL> *)&const_int_flag_0);
  if (!bVar1) {
    __assert_fail("unknown.all()",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x4b,"int main()");
  }
  const_int_flag_1 = const_int_flag_0;
  tfl::detail::typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,has_tail>>::
  reset<eats_meat,eats_grass,has_tail>
            ((typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,has_tail>> *)&const_int_flag_1
            );
  bVar1 = tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::operator!=
                    ((typed_flags<eats_meat,_eats_grass,_has_tail> *)&const_int_flag_1,
                     (this_type *)&const_int_flag_0);
  if (!bVar1) {
    __assert_fail("tmp != unknown",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x4e,"int main()");
  }
  tfl::detail::flags_storage<3UL>::reset((flags_storage<3UL> *)&const_int_flag_0);
  bVar1 = tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::operator==
                    ((typed_flags<eats_meat,_eats_grass,_has_tail> *)&const_int_flag_1,
                     (this_type *)&const_int_flag_0);
  if (!bVar1) {
    __assert_fail("tmp == unknown",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x50,"int main()");
  }
  iVar3 = tfl::detail::flags_storage<3UL>::to_integral<int>((flags_storage<3UL> *)&const_int_flag_0)
  ;
  if (iVar3 != 0) {
    __assert_fail("unknown.to_integral<int>() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x51,"int main()");
  }
  bVar1 = tfl::detail::flags_storage<3UL>::none((flags_storage<3UL> *)&const_int_flag_0);
  if (!bVar1) {
    __assert_fail("unknown.none()",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x52,"int main()");
  }
  bVar1 = tfl::detail::flags_storage<3UL>::any((flags_storage<3UL> *)&const_int_flag_0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!unknown.any()",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x53,"int main()");
  }
  bVar1 = tfl::detail::flags_storage<3UL>::all((flags_storage<3UL> *)&const_int_flag_0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!unknown.all()",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x54,"int main()");
  }
  bVar1 = tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::operator!=
                    ((typed_flags<eats_meat,_eats_grass,_has_tail> *)&const_int_flag_0,
                     (this_type *)&local_f);
  if (!bVar1) {
    __assert_fail("unknown != wolf",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x55,"int main()");
  }
  const_int_flag_0.value = (bool)local_f._M_elems[0];
  bVar1 = tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::operator==
                    ((typed_flags<eats_meat,_eats_grass,_has_tail> *)&const_int_flag_0,
                     (this_type *)&local_f);
  if (!bVar1) {
    __assert_fail("unknown == wolf",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x57,"int main()");
  }
  iVar3 = tfl::detail::flags_storage<3UL>::to_integral<int>((flags_storage<3UL> *)&const_int_flag_0)
  ;
  iVar4 = tfl::detail::flags_storage<3UL>::to_integral<int>((flags_storage<3UL> *)&local_f);
  if (iVar3 != iVar4) {
    __assert_fail("unknown.to_integral<int>() == wolf.to_integral<int>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x58,"int main()");
  }
  tfl::typed_flags<eats_meat,_eats_grass,_builds_spaceships>::typed_flags
            ((typed_flags<eats_meat,_eats_grass,_builds_spaceships> *)&int_flag);
  bVar1 = tfl::detail::
          typed_flags_facet<tfl::typed_flags<eats_meat,_eats_grass,_builds_spaceships>_>::
          none<eats_meat>((typed_flags_facet<tfl::typed_flags<eats_meat,_eats_grass,_builds_spaceships>_>
                           *)&int_flag);
  if (!bVar1) {
    __assert_fail("(engineer.none<eats_meat>())",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x5b,"int main()");
  }
  bVar1 = tfl::detail::typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,builds_spaceships>>::
          none<eats_meat,eats_grass>
                    ((typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,builds_spaceships>> *)
                     &int_flag);
  if (!bVar1) {
    __assert_fail("(engineer.none<eats_meat, eats_grass>())",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x5c,"int main()");
  }
  bVar1 = tfl::detail::typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,builds_spaceships>>::
          none<eats_meat,eats_grass,builds_spaceships>
                    ((typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,builds_spaceships>> *)
                     &int_flag);
  if (!bVar1) {
    __assert_fail("(engineer.none<eats_meat, eats_grass, builds_spaceships>())",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x5d,"int main()");
  }
  bVar1 = tfl::typed_flags<eats_meat,_eats_grass,_builds_spaceships>::any<eats_meat>
                    ((typed_flags<eats_meat,_eats_grass,_builds_spaceships> *)&int_flag);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("(!engineer.any<eats_meat>())",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x5e,"int main()");
  }
  bVar1 = tfl::typed_flags<eats_meat,eats_grass,builds_spaceships>::any<eats_meat,eats_grass>
                    ((typed_flags<eats_meat,eats_grass,builds_spaceships> *)&int_flag);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("(!engineer.any<eats_meat, eats_grass>())",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x5f,"int main()");
  }
  bVar1 = tfl::typed_flags<eats_meat,eats_grass,builds_spaceships>::
          any<eats_meat,eats_grass,builds_spaceships>
                    ((typed_flags<eats_meat,eats_grass,builds_spaceships> *)&int_flag);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("(!engineer.any<eats_meat, eats_grass, builds_spaceships>())",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x60,"int main()");
  }
  bVar1 = tfl::detail::
          typed_flags_facet<tfl::typed_flags<eats_meat,_eats_grass,_builds_spaceships>_>::
          all<eats_meat>((typed_flags_facet<tfl::typed_flags<eats_meat,_eats_grass,_builds_spaceships>_>
                          *)&int_flag);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("(!engineer.all<eats_meat>())",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x61,"int main()");
  }
  bVar1 = tfl::detail::typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,builds_spaceships>>::
          all<eats_meat,eats_grass>
                    ((typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,builds_spaceships>> *)
                     &int_flag);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("(!engineer.all<eats_meat, eats_grass>())",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x62,"int main()");
  }
  bVar1 = tfl::detail::typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,builds_spaceships>>::
          all<eats_meat,eats_grass,builds_spaceships>
                    ((typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,builds_spaceships>> *)
                     &int_flag);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("(!engineer.all<eats_meat, eats_grass, builds_spaceships>())",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,99,"int main()");
  }
  tfl::detail::typed_flags_facet<tfl::typed_flags<eats_meat,_eats_grass,_builds_spaceships>_>::
  set<builds_spaceships>
            ((typed_flags_facet<tfl::typed_flags<eats_meat,_eats_grass,_builds_spaceships>_> *)
             &int_flag,true);
  iVar3 = tfl::detail::flags_storage<3UL>::to_integral<int>((flags_storage<3UL> *)&int_flag);
  if (iVar3 != 4) {
    __assert_fail("engineer.to_integral<int>() == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x65,"int main()");
  }
  bVar1 = tfl::detail::
          typed_flags_facet<tfl::typed_flags<eats_meat,_eats_grass,_builds_spaceships>_>::
          none<eats_meat>((typed_flags_facet<tfl::typed_flags<eats_meat,_eats_grass,_builds_spaceships>_>
                           *)&int_flag);
  if (!bVar1) {
    __assert_fail("(engineer.none<eats_meat>())",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x66,"int main()");
  }
  bVar1 = tfl::detail::typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,builds_spaceships>>::
          none<eats_meat,eats_grass>
                    ((typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,builds_spaceships>> *)
                     &int_flag);
  if (!bVar1) {
    __assert_fail("(engineer.none<eats_meat, eats_grass>())",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x67,"int main()");
  }
  bVar1 = tfl::detail::typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,builds_spaceships>>::
          none<eats_meat,eats_grass,builds_spaceships>
                    ((typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,builds_spaceships>> *)
                     &int_flag);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("(!engineer.none<eats_meat, eats_grass, builds_spaceships>())",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x68,"int main()");
  }
  bVar1 = tfl::typed_flags<eats_meat,_eats_grass,_builds_spaceships>::any<eats_meat>
                    ((typed_flags<eats_meat,_eats_grass,_builds_spaceships> *)&int_flag);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("(!engineer.any<eats_meat>())",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x69,"int main()");
  }
  bVar1 = tfl::typed_flags<eats_meat,eats_grass,builds_spaceships>::any<eats_meat,eats_grass>
                    ((typed_flags<eats_meat,eats_grass,builds_spaceships> *)&int_flag);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("(!engineer.any<eats_meat, eats_grass>())",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x6a,"int main()");
  }
  bVar1 = tfl::typed_flags<eats_meat,eats_grass,builds_spaceships>::
          any<eats_meat,eats_grass,builds_spaceships>
                    ((typed_flags<eats_meat,eats_grass,builds_spaceships> *)&int_flag);
  if (!bVar1) {
    __assert_fail("(engineer.any<eats_meat, eats_grass, builds_spaceships>())",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x6b,"int main()");
  }
  bVar1 = tfl::detail::
          typed_flags_facet<tfl::typed_flags<eats_meat,_eats_grass,_builds_spaceships>_>::
          all<eats_meat>((typed_flags_facet<tfl::typed_flags<eats_meat,_eats_grass,_builds_spaceships>_>
                          *)&int_flag);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("(!engineer.all<eats_meat>())",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x6c,"int main()");
  }
  bVar1 = tfl::detail::typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,builds_spaceships>>::
          all<eats_meat,eats_grass>
                    ((typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,builds_spaceships>> *)
                     &int_flag);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("(!engineer.all<eats_meat, eats_grass>())",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x6d,"int main()");
  }
  bVar1 = tfl::detail::typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,builds_spaceships>>::
          all<eats_meat,eats_grass,builds_spaceships>
                    ((typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,builds_spaceships>> *)
                     &int_flag);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("(!engineer.all<eats_meat, eats_grass, builds_spaceships>())",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x6e,"int main()");
  }
  tfl::detail::typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,builds_spaceships>>::
  flip<eats_meat,eats_grass,builds_spaceships>
            ((typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,builds_spaceships>> *)
             &int_flag);
  bVar1 = tfl::detail::
          typed_flags_facet<tfl::typed_flags<eats_meat,_eats_grass,_builds_spaceships>_>::
          none<eats_meat>((typed_flags_facet<tfl::typed_flags<eats_meat,_eats_grass,_builds_spaceships>_>
                           *)&int_flag);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("(!engineer.none<eats_meat>())",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x70,"int main()");
  }
  bVar1 = tfl::detail::typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,builds_spaceships>>::
          none<eats_meat,eats_grass>
                    ((typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,builds_spaceships>> *)
                     &int_flag);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("(!engineer.none<eats_meat, eats_grass>())",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x71,"int main()");
  }
  bVar1 = tfl::detail::typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,builds_spaceships>>::
          none<eats_meat,eats_grass,builds_spaceships>
                    ((typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,builds_spaceships>> *)
                     &int_flag);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("(!engineer.none<eats_meat, eats_grass, builds_spaceships>())",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x72,"int main()");
  }
  bVar1 = tfl::typed_flags<eats_meat,_eats_grass,_builds_spaceships>::any<eats_meat>
                    ((typed_flags<eats_meat,_eats_grass,_builds_spaceships> *)&int_flag);
  if (!bVar1) {
    __assert_fail("(engineer.any<eats_meat>())",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x73,"int main()");
  }
  bVar1 = tfl::typed_flags<eats_meat,eats_grass,builds_spaceships>::any<eats_meat,eats_grass>
                    ((typed_flags<eats_meat,eats_grass,builds_spaceships> *)&int_flag);
  if (!bVar1) {
    __assert_fail("(engineer.any<eats_meat, eats_grass>())",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x74,"int main()");
  }
  bVar1 = tfl::typed_flags<eats_meat,eats_grass,builds_spaceships>::
          any<eats_meat,eats_grass,builds_spaceships>
                    ((typed_flags<eats_meat,eats_grass,builds_spaceships> *)&int_flag);
  if (!bVar1) {
    __assert_fail("(engineer.any<eats_meat, eats_grass, builds_spaceships>())",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x75,"int main()");
  }
  bVar1 = tfl::detail::
          typed_flags_facet<tfl::typed_flags<eats_meat,_eats_grass,_builds_spaceships>_>::
          all<eats_meat>((typed_flags_facet<tfl::typed_flags<eats_meat,_eats_grass,_builds_spaceships>_>
                          *)&int_flag);
  if (bVar1) {
    bVar1 = tfl::detail::typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,builds_spaceships>>
            ::all<eats_meat,eats_grass>
                      ((typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,builds_spaceships>>
                        *)&int_flag);
    if (!bVar1) {
      __assert_fail("(engineer.all<eats_meat, eats_grass>())",
                    "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                    ,0x77,"int main()");
    }
    bVar1 = tfl::detail::typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,builds_spaceships>>
            ::all<eats_meat,eats_grass,builds_spaceships>
                      ((typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,builds_spaceships>>
                        *)&int_flag);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("(!engineer.all<eats_meat, eats_grass, builds_spaceships>())",
                    "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                    ,0x78,"int main()");
    }
    tfl::detail::flags_storage<3UL>::flip((flags_storage<3UL> *)&int_flag);
    bVar1 = tfl::typed_flags<eats_meat,_eats_grass,_builds_spaceships>::test<eats_meat>
                      ((typed_flags<eats_meat,_eats_grass,_builds_spaceships> *)&int_flag);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!engineer.test<eats_meat>()",
                    "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                    ,0x7a,"int main()");
    }
    bVar1 = tfl::typed_flags<eats_meat,_eats_grass,_builds_spaceships>::test<eats_grass>
                      ((typed_flags<eats_meat,_eats_grass,_builds_spaceships> *)&int_flag);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!engineer.test<eats_grass>()",
                    "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                    ,0x7b,"int main()");
    }
    bVar1 = tfl::typed_flags<eats_meat,_eats_grass,_builds_spaceships>::test<builds_spaceships>
                      ((typed_flags<eats_meat,_eats_grass,_builds_spaceships> *)&int_flag);
    if (!bVar1) {
      __assert_fail("engineer.test<builds_spaceships>()",
                    "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                    ,0x7c,"int main()");
    }
    iVar3 = tfl::detail::flags_storage<3UL>::to_integral<int>((flags_storage<3UL> *)&int_flag);
    if (iVar3 != 4) {
      __assert_fail("engineer.to_integral<int>() == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                    ,0x7d,"int main()");
    }
    tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::typed_flags
              ((typed_flags<eats_meat,_eats_grass,_has_tail> *)&local_a5,0xffff);
    const_int_flag_0.value = (bool)local_a5._M_elems[0];
    iVar3 = tfl::detail::flags_storage<3UL>::to_integral<int>
                      ((flags_storage<3UL> *)&const_int_flag_0);
    if (iVar3 != 7) {
      __assert_fail("unknown.to_integral<int>() == 7",
                    "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                    ,0x82,"int main()");
    }
    local_a6.m_data._M_elems[0] =
         (array<unsigned_char,_1UL>)
         tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::operator~
                   ((typed_flags<eats_meat,_eats_grass,_has_tail> *)&const_int_flag_0);
    const_int_flag_0.value = (bool)local_a6.m_data._M_elems[0];
    iVar3 = tfl::detail::flags_storage<3UL>::to_integral<int>
                      ((flags_storage<3UL> *)&const_int_flag_0);
    if (iVar3 != 0) {
      __assert_fail("unknown.to_integral<int>() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                    ,0x84,"int main()");
    }
    tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::typed_flags(&local_a7,2);
    tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::operator|=
              ((typed_flags<eats_meat,_eats_grass,_has_tail> *)&const_int_flag_0,&local_a7);
    iVar3 = tfl::detail::flags_storage<3UL>::to_integral<int>
                      ((flags_storage<3UL> *)&const_int_flag_0);
    if (iVar3 != 2) {
      __assert_fail("unknown.to_integral<int>() == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                    ,0x86,"int main()");
    }
    tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::typed_flags(&local_a8,7);
    tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::operator^=
              ((typed_flags<eats_meat,_eats_grass,_has_tail> *)&const_int_flag_0,&local_a8);
    iVar3 = tfl::detail::flags_storage<3UL>::to_integral<int>
                      ((flags_storage<3UL> *)&const_int_flag_0);
    if (iVar3 != 5) {
      __assert_fail("unknown.to_integral<int>() == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                    ,0x88,"int main()");
    }
    tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::typed_flags(&local_a9,4);
    tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::operator&=
              ((typed_flags<eats_meat,_eats_grass,_has_tail> *)&const_int_flag_0,&local_a9);
    iVar3 = tfl::detail::flags_storage<3UL>::to_integral<int>
                      ((flags_storage<3UL> *)&const_int_flag_0);
    if (iVar3 != 4) {
      __assert_fail("unknown.to_integral<int>() == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                    ,0x8a,"int main()");
    }
    memset(&local_aa,0,1);
    f1.value = true;
    tfl::flag<int>::flag((flag<int> *)&f2);
    bVar2 = tfl::flag::operator_cast_to_bool((flag *)&f2);
    bVar1 = false;
    if (!bVar2) {
      bVar1 = tfl::flag::operator_cast_to_bool((flag *)&f2);
      bVar2 = tfl::flag::operator_cast_to_bool(&local_aa);
      bVar1 = bVar1 == bVar2;
    }
    if (!bVar1) {
      __assert_fail("!int_flag && int_flag == const_int_flag_0",
                    "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                    ,0x8f,"int main()");
    }
    tfl::flag<int>::operator=((flag<int> *)&f2,true);
    bVar2 = tfl::flag::operator_cast_to_bool((flag *)&f2);
    bVar1 = false;
    if (bVar2) {
      bVar1 = tfl::flag::operator_cast_to_bool((flag *)&f2);
      bVar2 = tfl::flag::operator_cast_to_bool((flag *)&f1);
      bVar1 = bVar1 == bVar2;
    }
    if (!bVar1) {
      __assert_fail("int_flag && int_flag == const_int_flag_1",
                    "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                    ,0x91,"int main()");
    }
    tfl::flag<int>::operator=((flag<int> *)&f2,false);
    bVar1 = tfl::flag::operator_cast_to_bool((flag *)&f2);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!int_flag",
                    "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                    ,0x93,"int main()");
    }
    tfl::flag<has_tail>::flag((flag<has_tail> *)&a1,true);
    tfl::flag<eats_grass>::flag(&local_af,true);
    tfl::typed_flags<eats_meat,eats_grass,has_tail>::typed_flags<has_tail,eats_grass>
              ((typed_flags<eats_meat,eats_grass,has_tail> *)&f3,
               (flag<has_tail>)a1.super_flags_storage<3UL>.m_data._M_elems[0],local_af);
    const_int_flag_0.value = f3.value;
    bVar1 = tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::operator==
                      ((typed_flags<eats_meat,_eats_grass,_has_tail> *)&const_int_flag_0,
                       (this_type *)&local_a1);
    if (!bVar1) {
      __assert_fail("unknown == rabbit",
                    "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                    ,0x96,"int main()");
    }
    tfl::flag<eats_meat>::flag(&local_b0,true);
    tfl::detail::typed_flags_facet<tfl::typed_flags<eats_meat,_eats_grass,_has_tail>_>::
    set<eats_meat>((typed_flags_facet<tfl::typed_flags<eats_meat,_eats_grass,_has_tail>_> *)
                   &const_int_flag_0,local_b0);
    bVar1 = tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::operator!=
                      ((typed_flags<eats_meat,_eats_grass,_has_tail> *)&const_int_flag_0,
                       (this_type *)&local_a1);
    if (!bVar1) {
      __assert_fail("unknown != rabbit",
                    "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                    ,0x98,"int main()");
    }
    tfl::flag<eats_meat>::flag(&local_b1,false);
    tfl::flag<eats_grass>::flag(&local_b2,true);
    tfl::detail::typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,has_tail>>::
    set<eats_meat,eats_grass>
              ((typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,has_tail>> *)
               &const_int_flag_0,local_b1,local_b2);
    bVar1 = tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::operator==
                      ((typed_flags<eats_meat,_eats_grass,_has_tail> *)&const_int_flag_0,
                       (this_type *)&local_a1);
    if (!bVar1) {
      __assert_fail("unknown == rabbit",
                    "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                    ,0x9a,"int main()");
    }
    tfl::flag<eats_meat>::flag(&local_b3);
    tfl::flag<eats_grass>::flag(&local_b4);
    tfl::flag<has_tail>::flag(&local_b5);
    tfl::detail::typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,has_tail>>::
    get<eats_meat,eats_grass,has_tail>
              ((typed_flags_facet<tfl::typed_flags<eats_meat,eats_grass,has_tail>> *)
               &const_int_flag_0,&local_b3,&local_b4,&local_b5);
    bVar1 = tfl::flag::operator_cast_to_bool((flag *)&local_b4);
    local_1dd = false;
    if (bVar1) {
      local_1dd = tfl::flag::operator_cast_to_bool((flag *)&local_b5);
    }
    if (local_1dd == false) {
      __assert_fail("f2 && f3",
                    "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                    ,0x9f,"int main()");
    }
    bVar1 = tfl::flag::operator_cast_to_bool((flag *)&local_b3);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!f1",
                    "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                    ,0xa0,"int main()");
    }
    tfl::typed_flags<eats_meat,eats_grass,has_tail>::typed_flags<char,std::char_traits<char>>
              (&local_b7,"111",0xffffffffffffffff,'0','1');
    tfl::typed_flags<eats_meat,eats_grass,has_tail>::typed_flags<char,std::char_traits<char>>
              (&local_b8,"010",0xffffffffffffffff,'0','1');
    local_b6.m_data._M_elems[0] =
         (array<unsigned_char,_1UL>)
         tfl::operator&((typed_flags<eats_meat,_eats_grass,_has_tail> *)&local_b7,
                        (typed_flags<eats_meat,_eats_grass,_has_tail> *)&local_b8);
    tfl::detail::flags_storage<3ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
              (local_d8,(char)&local_b6,'0');
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_d8,"010");
    if (bVar1) {
      std::__cxx11::string::~string((string *)local_d8);
      tfl::typed_flags<eats_meat,eats_grass,has_tail>::typed_flags<char,std::char_traits<char>>
                (&local_da,"11100",0xffffffffffffffff,'0','1');
      tfl::typed_flags<eats_meat,eats_grass,has_tail>::typed_flags<char,std::char_traits<char>>
                (&local_db,"11001",0xffffffffffffffff,'0','1');
      local_d9.m_data._M_elems[0] =
           (array<unsigned_char,_1UL>)
           tfl::operator|((typed_flags<eats_meat,_eats_grass,_has_tail> *)&local_da,
                          (typed_flags<eats_meat,_eats_grass,_has_tail> *)&local_db);
      tfl::detail::flags_storage<3ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
                (local_100,(char)&local_d9,'0');
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_100,"101");
      if (!bVar1) {
        __assert_fail("a2.to_string() == \"101\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                      ,0xa5,"int main()");
      }
      std::__cxx11::string::~string((string *)local_100);
      tfl::typed_flags<eats_meat,eats_grass,has_tail>::typed_flags<char,std::char_traits<char>>
                (&local_102,"10",0xffffffffffffffff,'0','1');
      tfl::typed_flags<eats_meat,eats_grass,has_tail>::typed_flags<char,std::char_traits<char>>
                (&local_103,"11",0xffffffffffffffff,'0','1');
      local_101.m_data._M_elems[0] =
           (array<unsigned_char,_1UL>)
           tfl::operator^((typed_flags<eats_meat,_eats_grass,_has_tail> *)&local_102,
                          (typed_flags<eats_meat,_eats_grass,_has_tail> *)&local_103);
      tfl::detail::flags_storage<3ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
                (local_128,(char)&local_101,'0');
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_128,"001");
      if (bVar1) {
        std::__cxx11::string::~string((string *)local_128);
        tfl::typed_flags<eats_meat,eats_grass,has_tail>::typed_flags<char,std::char_traits<char>>
                  ((typed_flags<eats_meat,eats_grass,has_tail> *)((long)&anon_var_9 + 7),"X",
                   0xffffffffffffffff,'0','1');
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                      ,0xab,"int main()");
      }
      __assert_fail("a3.to_string() == \"001\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                    ,0xa7,"int main()");
    }
    __assert_fail("a1.to_string() == \"010\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0xa3,"int main()");
  }
  __assert_fail("(engineer.all<eats_meat>())",
                "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                ,0x76,"int main()");
}

Assistant:

int main()
{    
    //typed_flags<eats_meat, eats_meat> ill_formed; // compilation error!
    
    typed_flags<> empty;
    assert( empty.size() == 0 );
    assert( sizeof(empty) == 1 );
    assert( empty.to_integral<int>() == 0 );
    assert( empty.none<>() );
    assert( !empty.any<>() );
    assert( empty.all<>() );
    empty = typed_flags<>(1);
    assert( empty.to_integral<int>() == 0 );
        
    assert( animal::index<eats_meat>() == 0 );
    assert( animal::index<eats_grass>() == 1 );
    assert( animal::index<has_tail>() == 2 );
    //animal::index<builds_spaceships>(); // compilation error!
    
    animal wolf;
    assert( wolf.size() == 3 );
    assert( sizeof(wolf) == 1 );
    assert( !wolf.test<eats_meat>() );
    assert( !wolf.test<eats_grass>() );
    assert( !wolf.test<has_tail>() );
    assert( wolf.to_string() == "000" );
    wolf.set<eats_meat>();
    assert( wolf.test<eats_meat>() );
    assert( wolf.to_string() == "001" );
    wolf.set<eats_grass>(true);
    assert( wolf.test<eats_grass>() );
    assert( wolf.to_string('-') == "-11" );
    wolf.set<eats_grass>(false);
    assert( !wolf.test<eats_grass>() );
    wolf.set<has_tail>();
    assert( wolf.test<has_tail>() );
    assert( wolf.to_integral<int>() == 5 );
    assert( wolf.to_string('-', '+') == "+-+" );
    
    animal rabbit;
    rabbit.set<eats_grass, has_tail>();
    assert( !rabbit.test<eats_meat>() );
    assert( rabbit.test<eats_grass>() );
    assert( rabbit.test<has_tail>() );
    assert( rabbit.to_integral<int>() == 6 );
    
    animal unknown;
    assert( unknown.to_integral<int>() == 0 );
    assert( unknown.none() );
    assert( !unknown.any() );
    assert( !unknown.all() );
    unknown.set();
    assert( unknown.to_integral<int>() == 7 );
    assert( !unknown.none() );
    assert( unknown.any() );
    assert( unknown.all() );
    animal tmp = unknown;
    tmp.reset<eats_meat, eats_grass, has_tail>();
    assert( tmp != unknown );
    unknown.reset();
    assert( tmp == unknown );
    assert( unknown.to_integral<int>() == 0 );
    assert( unknown.none() );
    assert( !unknown.any() );
    assert( !unknown.all() );
    assert( unknown != wolf );
    unknown = wolf;
    assert( unknown == wolf );
    assert( unknown.to_integral<int>() == wolf.to_integral<int>() );
    
    human engineer;
    assert( (engineer.none<eats_meat>()) );
    assert( (engineer.none<eats_meat, eats_grass>()) );
    assert( (engineer.none<eats_meat, eats_grass, builds_spaceships>()) );
    assert( (!engineer.any<eats_meat>()) );
    assert( (!engineer.any<eats_meat, eats_grass>()) );
    assert( (!engineer.any<eats_meat, eats_grass, builds_spaceships>()) );
    assert( (!engineer.all<eats_meat>()) );
    assert( (!engineer.all<eats_meat, eats_grass>()) );
    assert( (!engineer.all<eats_meat, eats_grass, builds_spaceships>()) );
    engineer.set<builds_spaceships>();
    assert( engineer.to_integral<int>() == 4 );
    assert( (engineer.none<eats_meat>()) );
    assert( (engineer.none<eats_meat, eats_grass>()) );
    assert( (!engineer.none<eats_meat, eats_grass, builds_spaceships>()) );
    assert( (!engineer.any<eats_meat>()) );
    assert( (!engineer.any<eats_meat, eats_grass>()) );
    assert( (engineer.any<eats_meat, eats_grass, builds_spaceships>()) );
    assert( (!engineer.all<eats_meat>()) );
    assert( (!engineer.all<eats_meat, eats_grass>()) );
    assert( (!engineer.all<eats_meat, eats_grass, builds_spaceships>()) );
    engineer.flip<eats_meat, eats_grass, builds_spaceships>();
    assert( (!engineer.none<eats_meat>()) );
    assert( (!engineer.none<eats_meat, eats_grass>()) );
    assert( (!engineer.none<eats_meat, eats_grass, builds_spaceships>()) );
    assert( (engineer.any<eats_meat>()) );
    assert( (engineer.any<eats_meat, eats_grass>()) );
    assert( (engineer.any<eats_meat, eats_grass, builds_spaceships>()) );
    assert( (engineer.all<eats_meat>()) );
    assert( (engineer.all<eats_meat, eats_grass>()) );
    assert( (!engineer.all<eats_meat, eats_grass, builds_spaceships>()) );
    engineer.flip();
    assert( !engineer.test<eats_meat>() );
    assert( !engineer.test<eats_grass>() );
    assert( engineer.test<builds_spaceships>() );
    assert( engineer.to_integral<int>() == 4 );
    
    //engineer = wolf; // compilation error!
    
    unknown = animal{65535};
    assert( unknown.to_integral<int>() == 7 );
    unknown = ~unknown;
    assert( unknown.to_integral<int>() == 0 );
    unknown |= animal{2};
    assert( unknown.to_integral<int>() == 2 );
    unknown ^= animal{7};
    assert( unknown.to_integral<int>() == 5 );
    unknown &= animal{4};
    assert( unknown.to_integral<int>() == 4 );
    
    constexpr flag<int> const_int_flag_0;
    constexpr flag<int> const_int_flag_1{1};
    flag<int> int_flag;
    assert( !int_flag && int_flag == const_int_flag_0 );
    int_flag = true;
    assert( int_flag && int_flag == const_int_flag_1 );
    int_flag = false;
    assert( !int_flag );
    
    unknown = animal{flag<has_tail>{1}, flag<eats_grass>{1}};
    assert( unknown == rabbit );
    unknown.set(flag<eats_meat>{1});
    assert( unknown != rabbit );
    unknown.set(flag<eats_meat>{0}, flag<eats_grass>{1});
    assert( unknown == rabbit );
    flag<eats_meat> f1;
    flag<eats_grass> f2;
    flag<has_tail> f3;
    unknown.get(f1, f2, f3);
    assert( f2 && f3 );
    assert( !f1 );
    
    auto a1 = animal{"111"} & animal{"010"};
    assert( a1.to_string() == "010" );
    auto a2 = animal{"11100"} | animal{"11001"};
    assert( a2.to_string() == "101" );
    auto a3 = animal{"10"} ^ animal{"11"};
    assert( a3.to_string() == "001" );
    try
    {
        animal{"X"};
        assert( false );
    }
    catch (std::invalid_argument const&)
    {
    }
    
    typed_flags<class f1, class f2, class f3, 
                class f4, class f5, class f6, 
                class f7, class f8>
                flags_8;
    assert( flags_8.size() == 8 );
    assert( sizeof(flags_8) == 1 );
    flags_8.set<class f8>();
    assert( flags_8.to_integral<int>() == 128 );
    assert( flags_8.to_string() == "10000000" );
    
    typed_flags<class f1, class f2, class f3, 
                class f4, class f5, class f6, 
                class f7, class f8, class f9>
                flags_9;
    assert( flags_9.size() == 9 );
    assert( sizeof(flags_9) == 2 );
    //flags_9.to_integral<uint8_t>(); // compilation error!
    flags_9.set<class f1, class f9>();
    assert( flags_9.to_integral<int>() == 257 );
    assert( flags_9.to_string() == "100000001" );
    
    return 0;
}